

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

Image<double> *
eos::core::image::constant<double>
          (Image<double> *__return_storage_ptr__,int height,int width,double value)

{
  double *pdVar1;
  undefined4 local_2c;
  undefined4 local_28;
  int x;
  int y;
  double value_local;
  int width_local;
  int height_local;
  Image<double> *image;
  
  Image<double>::Image(__return_storage_ptr__,height,width);
  for (local_28 = 0; local_28 < height; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < width; local_2c = local_2c + 1) {
      pdVar1 = Image<double>::operator()(__return_storage_ptr__,local_28,local_2c);
      *pdVar1 = value;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image<PixelType> constant(int height, int width, PixelType value) noexcept
{
    Image<PixelType> image(height, width);
    for (int y = 0; y < height; ++y)
    {
        for (int x = 0; x < width; ++x)
        {
            image(y, x) = value;
        }
    }
    return image;
}